

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnATM.cpp
# Opt level: O3

void __thiscall
VariationalBayesEstimatorOnATM::updateBeta
          (VariationalBayesEstimatorOnATM *this,BetaUpdateManner manner)

{
  double dVar1;
  pointer pdVar2;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *in_RCX;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *pol;
  integral_constant<int,_53> *in_RDX;
  integral_constant<int,_53> *extraout_RDX;
  integral_constant<int,_53> *extraout_RDX_00;
  integral_constant<int,_53> *extraout_RDX_01;
  integral_constant<int,_53> *extraout_RDX_02;
  integral_constant<int,_53> *extraout_RDX_03;
  integral_constant<int,_53> *extraout_RDX_04;
  integral_constant<int,_53> *extraout_RDX_05;
  integral_constant<int,_53> *extraout_RDX_06;
  integral_constant<int,_53> *extraout_RDX_07;
  integral_constant<int,_53> *extraout_RDX_08;
  integral_constant<int,_53> *extraout_RDX_09;
  integral_constant<int,_53> *extraout_RDX_10;
  integral_constant<int,_53> *piVar3;
  integral_constant<int,_53> *extraout_RDX_11;
  integral_constant<int,_53> *extraout_RDX_12;
  integral_constant<int,_53> *extraout_RDX_13;
  integral_constant<int,_53> *extraout_RDX_14;
  long lVar4;
  ulong uVar5;
  policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
  *ppVar6;
  ulong uVar7;
  integral_constant<int,_53> *piVar8;
  longdouble in_ST0;
  longdouble lVar9;
  longdouble lVar10;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar11;
  longdouble lVar12;
  longdouble in_ST5;
  double dVar13;
  double dVar14;
  double commonBeta;
  double local_c8;
  undefined2 uStack_c0;
  double local_b8;
  double local_a0;
  ulong local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  if (manner == SYMMETRY) {
    if (this->_K == 0) {
      local_c8 = NAN;
    }
    else {
      dVar13 = 0.0;
      uVar7 = 0;
      lVar9 = (longdouble)1.79769313486232e+308;
      dVar14 = 0.0;
      do {
        _local_c8 = CONCAT28(uStack_c0,dVar14);
        local_98 = uVar7;
        if (this->_V != 0) {
          pdVar2 = (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          ppVar6 = (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                    *)0x0;
          do {
            pol = *(policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                    **)&(this->_nkv).
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar7].
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
            local_68 = *(double *)(pol + (long)ppVar6 * 8) + pdVar2[(long)ppVar6];
            boost::math::detail::
            digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      ((longdouble *)0x0,(detail *)&local_a0,(longdouble)local_68,in_RDX,pol);
            piVar3 = extraout_RDX_03;
            lVar10 = in_ST1;
            lVar11 = in_ST3;
            lVar12 = in_ST5;
            if (lVar9 < ABS(in_ST0)) {
              boost::math::policies::detail::raise_error<std::overflow_error,double>
                        ("boost::math::digamma<%1%>(%1%)","numeric overflow");
              piVar3 = extraout_RDX_04;
              lVar10 = in_ST1;
              lVar11 = in_ST3;
            }
            in_ST3 = in_ST5;
            in_ST1 = lVar11;
            dVar14 = (double)in_ST0;
            local_70 = dVar14;
            boost::math::detail::
            digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      ((longdouble *)0x0,(detail *)&local_a0,
                       (longdouble)
                       (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)ppVar6],piVar3,pol);
            in_RDX = extraout_RDX_05;
            in_ST0 = in_ST2;
            lVar11 = in_ST4;
            in_ST5 = lVar12;
            if (lVar9 < ABS(lVar10)) {
              boost::math::policies::detail::raise_error<std::overflow_error,double>
                        ("boost::math::digamma<%1%>(%1%)","numeric overflow");
              in_RDX = extraout_RDX_06;
              in_ST0 = in_ST2;
              lVar11 = in_ST4;
            }
            in_ST4 = lVar12;
            in_ST2 = lVar11;
            local_78 = (double)lVar10;
            pdVar2 = (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            _local_c8 = CONCAT28(uStack_c0,local_c8 + (dVar14 - local_78) * pdVar2[(long)ppVar6]);
            ppVar6 = ppVar6 + 1;
            in_RCX = (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                      *)(ulong)this->_V;
          } while (ppVar6 < in_RCX);
        }
        uVar7 = local_98;
        local_80 = (this->_nk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[local_98] + this->_betaSum;
        boost::math::detail::
        digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                  ((longdouble *)0x0,(detail *)&local_a0,(longdouble)local_80,in_RDX,in_RCX);
        piVar3 = extraout_RDX_07;
        lVar10 = in_ST1;
        lVar11 = in_ST3;
        lVar12 = in_ST5;
        if (lVar9 < ABS(in_ST0)) {
          boost::math::policies::detail::raise_error<std::overflow_error,double>
                    ("boost::math::digamma<%1%>(%1%)","numeric overflow");
          piVar3 = extraout_RDX_08;
          lVar10 = in_ST1;
          lVar11 = in_ST3;
        }
        in_ST3 = in_ST5;
        in_ST1 = lVar11;
        dVar14 = (double)in_ST0;
        local_88 = dVar14;
        boost::math::detail::
        digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                  ((longdouble *)0x0,(detail *)&local_a0,(longdouble)this->_betaSum,piVar3,in_RCX);
        in_RDX = extraout_RDX_09;
        in_ST0 = in_ST2;
        lVar11 = in_ST4;
        in_ST5 = lVar12;
        if (lVar9 < ABS(lVar10)) {
          boost::math::policies::detail::raise_error<std::overflow_error,double>
                    ("boost::math::digamma<%1%>(%1%)","numeric overflow");
          in_RDX = extraout_RDX_10;
          in_ST0 = in_ST2;
          lVar11 = in_ST4;
        }
        in_ST4 = lVar12;
        in_ST2 = lVar11;
        local_90 = (double)lVar10;
        dVar13 = dVar13 + (dVar14 - local_90);
        uVar7 = uVar7 + 1;
        dVar14 = local_c8;
      } while (uVar7 < this->_K);
      local_c8 = local_c8 / dVar13;
    }
    local_a0 = local_c8 / (double)this->_V;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (&this->_beta,(ulong)this->_V,&local_a0);
  }
  else {
    if (this->_K == 0) {
      local_b8 = 0.0;
      uVar7 = 0;
    }
    else {
      local_b8 = 0.0;
      uVar5 = 0;
      do {
        local_38 = (this->_nk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar5] + this->_betaSum;
        boost::math::detail::
        digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                  ((longdouble *)0x0,(detail *)&local_a0,(longdouble)local_38,in_RDX,in_RCX);
        piVar3 = extraout_RDX;
        lVar9 = in_ST1;
        lVar10 = in_ST3;
        lVar11 = in_ST5;
        if ((longdouble)1.79769313486232e+308 < ABS(in_ST0)) {
          boost::math::policies::detail::raise_error<std::overflow_error,double>
                    ("boost::math::digamma<%1%>(%1%)","numeric overflow");
          piVar3 = extraout_RDX_00;
          lVar9 = in_ST1;
          lVar10 = in_ST3;
        }
        in_ST3 = in_ST5;
        in_ST1 = lVar10;
        dVar14 = (double)in_ST0;
        local_40 = dVar14;
        boost::math::detail::
        digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                  ((longdouble *)0x0,(detail *)&local_a0,(longdouble)this->_betaSum,piVar3,in_RCX);
        in_RDX = extraout_RDX_01;
        in_ST0 = in_ST2;
        lVar10 = in_ST4;
        in_ST5 = lVar11;
        if ((longdouble)1.79769313486232e+308 < ABS(lVar9)) {
          boost::math::policies::detail::raise_error<std::overflow_error,double>
                    ("boost::math::digamma<%1%>(%1%)","numeric overflow");
          in_RDX = extraout_RDX_02;
          in_ST0 = in_ST2;
          lVar10 = in_ST4;
        }
        in_ST4 = lVar11;
        in_ST2 = lVar10;
        local_48 = (double)lVar9;
        local_b8 = local_b8 + (dVar14 - local_48);
        uVar5 = uVar5 + 1;
        uVar7 = (ulong)this->_K;
      } while (uVar5 < uVar7);
    }
    piVar3 = (integral_constant<int,_53> *)(ulong)this->_V;
    if (this->_V != 0) {
      ppVar6 = (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                *)(this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
      piVar8 = (integral_constant<int,_53> *)0x0;
      do {
        if ((int)uVar7 == 0) {
          dVar14 = 0.0;
          uVar7 = 0;
        }
        else {
          dVar13 = *(double *)(ppVar6 + (long)piVar8 * 8);
          dVar14 = 0.0;
          lVar4 = 0;
          uVar5 = 0;
          do {
            local_50 = dVar13 + *(double *)
                                 (*(long *)((long)&(((this->_nkv).
                                                                                                          
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data + lVar4) +
                                 (long)piVar8 * 8);
            boost::math::detail::
            digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      ((longdouble *)0x0,(detail *)&local_a0,(longdouble)local_50,piVar3,ppVar6);
            piVar3 = extraout_RDX_11;
            lVar9 = in_ST1;
            lVar10 = in_ST3;
            lVar11 = in_ST5;
            if ((longdouble)1.79769313486232e+308 < ABS(in_ST0)) {
              boost::math::policies::detail::raise_error<std::overflow_error,double>
                        ("boost::math::digamma<%1%>(%1%)","numeric overflow");
              piVar3 = extraout_RDX_12;
              lVar9 = in_ST1;
              lVar10 = in_ST3;
            }
            in_ST3 = in_ST5;
            in_ST1 = lVar10;
            dVar1 = (double)in_ST0;
            local_58 = dVar1;
            boost::math::detail::
            digamma_imp<long_double,boost::integral_constant<int,53>,boost::math::policies::policy<boost::math::policies::promote_float<false>,boost::math::policies::promote_double<false>,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      ((longdouble *)0x0,(detail *)&local_a0,
                       (longdouble)
                       (this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)piVar8],piVar3,ppVar6);
            piVar3 = extraout_RDX_13;
            in_ST0 = in_ST2;
            lVar10 = in_ST4;
            in_ST5 = lVar11;
            if ((longdouble)1.79769313486232e+308 < ABS(lVar9)) {
              boost::math::policies::detail::raise_error<std::overflow_error,double>
                        ("boost::math::digamma<%1%>(%1%)","numeric overflow");
              piVar3 = extraout_RDX_14;
              in_ST0 = in_ST2;
              lVar10 = in_ST4;
            }
            in_ST4 = lVar11;
            in_ST2 = lVar10;
            local_60 = (double)lVar9;
            ppVar6 = (policy<boost::math::policies::promote_float<false>,_boost::math::policies::promote_double<false>,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                      *)(this->_beta).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
            dVar13 = *(double *)(ppVar6 + (long)piVar8 * 8);
            dVar14 = dVar14 + (dVar1 - local_60) * dVar13;
            uVar5 = uVar5 + 1;
            uVar7 = (ulong)this->_K;
            lVar4 = lVar4 + 0x18;
          } while (uVar5 < uVar7);
          piVar3 = (integral_constant<int,_53> *)(ulong)this->_V;
        }
        *(double *)(ppVar6 + (long)piVar8 * 8) = dVar14 / local_b8;
        piVar8 = piVar8 + 1;
      } while (piVar8 < piVar3);
    }
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->_betaTimeSeries,&this->_beta);
  return;
}

Assistant:

void VariationalBayesEstimatorOnATM::updateBeta(BetaUpdateManner manner){//{{{
    if(manner == SYMMETRY){
        double numerator=0;
        double denominator=0;
        for(int k=0;k<_K;k++){
            for(int v=0;v<_V;v++){
                numerator += (boost::math::digamma(_nkv[k][v]+_beta[v]) - boost::math::digamma(_beta[v]))*_beta[v];
            }
            denominator += boost::math::digamma(_nk[k]+_betaSum) - boost::math::digamma(_betaSum);
        }
        double commonBeta = numerator/denominator/_V;
        _beta.assign(_V, commonBeta);
    }else{
        double denominator=0;
        for(int k=0;k<_K;k++){
            denominator += boost::math::digamma(_nk[k]+_betaSum) - boost::math::digamma(_betaSum);
        }
        for(int v=0;v<_V;v++){
            double numerator=0;
            for(int k=0;k<_K;k++){
                numerator += (boost::math::digamma(_nkv[k][v]+_beta[v])-boost::math::digamma(_beta[v]))*_beta[v];
            }
            _beta[v] = numerator/denominator;
        }
    }
    _betaTimeSeries.push_back(_beta);
}